

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O1

NgramBuilder NgramBuilder_init(size_t *gram_nums,uint32_t order)

{
  size_t sVar1;
  uint uVar2;
  NgramBuilder pNVar3;
  HashVocab pHVar4;
  size_t *__dest;
  size_t *__s;
  char *pcVar5;
  char **ppcVar6;
  ulong uVar7;
  
  if (order != 0) {
    pNVar3 = (NgramBuilder)malloc(0x48);
    pHVar4 = HashVocab_init(*gram_nums);
    pNVar3->vocab = pHVar4;
    sVar1 = (ulong)order * 8;
    __dest = (size_t *)malloc(sVar1);
    pNVar3->gram_nums = __dest;
    __s = (size_t *)malloc(sVar1);
    pNVar3->added_gram_nums = __s;
    uVar7 = 0;
    memset(__s,0,sVar1);
    memcpy(__dest,gram_nums,sVar1);
    uVar2 = 0;
    do {
      uVar2 = uVar2 + (int)gram_nums[uVar7];
      uVar7 = uVar7 + 1;
    } while (order != uVar7);
    sVar1 = (ulong)uVar2 * 0x18;
    pNVar3->cache_size = sVar1;
    pNVar3->used_cache_size = 0;
    pcVar5 = (char *)malloc(sVar1);
    pNVar3->ngram_cache = pcVar5;
    ppcVar6 = (char **)malloc((ulong)uVar2 * 8);
    pNVar3->ngram_offsets = ppcVar6;
    pNVar3->added_total_gram_num = 0;
    pNVar3->order = order;
    return pNVar3;
  }
  __assert_fail("order > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c",
                0x135,"NgramBuilder NgramBuilder_init(const size_t *, uint32_t)");
}

Assistant:

NgramBuilder NgramBuilder_init(const size_t* gram_nums, uint32_t order){
    assert(order > 0);
    NgramBuilder builder = malloc(sizeof(struct NgramBuilder_T));
    builder->vocab = HashVocab_init(gram_nums[0]);
    builder->gram_nums = malloc(order*sizeof(size_t));
    builder->added_gram_nums = malloc(order*sizeof(size_t));
    uint32_t total_num = 0;
    for (uint32_t i = 0;i< order;i++) {
        builder->gram_nums[i] = gram_nums[i];
        builder->added_gram_nums[i] = 0;
        total_num += gram_nums[i];
    }

    builder->cache_size = avg_ngram_len*total_num;
    builder->used_cache_size = 0;
    builder->ngram_cache = malloc(builder->cache_size);

    builder->ngram_offsets = malloc(total_num * sizeof(char*));
    builder->added_total_gram_num = 0;
    builder->order = order;
    return builder;
}